

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_process.c
# Opt level: O3

unsigned_long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *bp,int *streamCallbackResult)

{
  uint uVar1;
  ulong uVar2;
  unsigned_long uVar3;
  long lVar4;
  unsigned_long uVar5;
  PaUtilChannelDescriptor *hostInputChannels;
  unsigned_long *puVar6;
  ulong uVar7;
  unsigned_long *puVar8;
  ulong framesToProcess;
  unsigned_long uVar9;
  unsigned_long noInputInputFrameCount;
  ulong local_38;
  
  uVar1 = bp->inputChannelCount;
  if ((((uVar1 != 0) && (bp->outputChannelCount != 0)) &&
      (bp->hostInputChannels[0]->data != (void *)0x0)) &&
     ((bp->hostOutputChannels[0]->data != (void *)0x0 &&
      (bp->hostInputFrameCount[1] + bp->hostInputFrameCount[0] !=
       bp->hostOutputFrameCount[1] + bp->hostOutputFrameCount[0])))) {
    __assert_fail("(bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) == (bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1])"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                  ,0x5d2,"unsigned long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *, int *)")
    ;
  }
  if (2 < (uint)*streamCallbackResult) {
    __assert_fail("*streamCallbackResult == paContinue || *streamCallbackResult == paComplete || *streamCallbackResult == paAbort"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                  ,0x5d7,"unsigned long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *, int *)")
    ;
  }
  if (bp->useNonAdaptingProcess == 0) {
    if (uVar1 == 0) {
      uVar9 = AdaptingOutputOnlyProcess
                        (bp,streamCallbackResult,bp->hostOutputChannels[0],
                         bp->hostOutputFrameCount[0]);
      if (bp->hostOutputFrameCount[1] == 0) {
        return uVar9;
      }
      uVar5 = AdaptingOutputOnlyProcess
                        (bp,streamCallbackResult,bp->hostOutputChannels[1],
                         bp->hostOutputFrameCount[1]);
    }
    else {
      if (bp->outputChannelCount != 0) {
        uVar9 = AdaptingProcess(bp,streamCallbackResult,
                                (uint)(bp->hostBufferSizeMode !=
                                      paUtilVariableHostBufferSizePartialUsageAllowed));
        return uVar9;
      }
      uVar9 = AdaptingInputOnlyProcess
                        (bp,streamCallbackResult,bp->hostInputChannels[0],bp->hostInputFrameCount[0]
                        );
      if (bp->hostInputFrameCount[1] == 0) {
        return uVar9;
      }
      uVar5 = AdaptingInputOnlyProcess
                        (bp,streamCallbackResult,bp->hostInputChannels[1],bp->hostInputFrameCount[1]
                        );
    }
  }
  else {
    if (uVar1 == 0) {
      lVar4 = 0xe8;
    }
    else {
      if (bp->outputChannelCount != 0) {
        uVar7 = bp->hostOutputFrameCount[1] + bp->hostOutputFrameCount[0];
        uVar9 = 0;
        while( true ) {
          hostInputChannels = bp->hostInputChannels[0];
          if (hostInputChannels->data == (void *)0x0) {
            puVar6 = &local_38;
            hostInputChannels = (PaUtilChannelDescriptor *)0x0;
            uVar2 = uVar7;
            local_38 = uVar7;
          }
          else {
            uVar2 = bp->hostInputFrameCount[0];
            puVar6 = bp->hostInputFrameCount;
            if (uVar2 == 0) {
              hostInputChannels = bp->hostInputChannels[1];
              uVar2 = bp->hostInputFrameCount[1];
              puVar6 = bp->hostInputFrameCount + 1;
            }
          }
          uVar5 = bp->hostOutputFrameCount[0];
          puVar8 = bp->hostOutputFrameCount;
          if (uVar5 == 0) {
            puVar8 = bp->hostOutputFrameCount + 1;
          }
          framesToProcess = *puVar8;
          if (uVar2 < *puVar8) {
            framesToProcess = uVar2;
          }
          if (framesToProcess == 0) break;
          uVar3 = NonAdaptingProcess(bp,streamCallbackResult,hostInputChannels,
                                     bp->hostOutputChannels[uVar5 == 0],framesToProcess);
          *puVar6 = *puVar6 - uVar3;
          bp->hostOutputFrameCount[uVar5 == 0] = bp->hostOutputFrameCount[uVar5 == 0] - uVar3;
          uVar9 = uVar9 + uVar3;
          uVar7 = uVar7 - uVar3;
          if (uVar7 == 0) {
            return uVar9;
          }
        }
        __assert_fail("framesToProcess != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/bkgood[P]portaudio-pulseaudio/src/common/pa_process.c"
                      ,0x616,
                      "unsigned long PaUtil_EndBufferProcessing(PaUtilBufferProcessor *, int *)");
      }
      lVar4 = 0xc0;
    }
    uVar9 = NonAdaptingProcess(bp,streamCallbackResult,bp->hostInputChannels[0],
                               bp->hostOutputChannels[0],
                               *(unsigned_long *)((long)&bp->framesPerUserBuffer + lVar4));
    puVar6 = bp->hostInputFrameCount;
    if (bp->inputChannelCount == 0) {
      puVar6 = bp->hostOutputFrameCount;
    }
    if (puVar6[1] == 0) {
      return uVar9;
    }
    uVar5 = NonAdaptingProcess(bp,streamCallbackResult,bp->hostInputChannels[1],
                               bp->hostOutputChannels[1],puVar6[1]);
  }
  return uVar9 + uVar5;
}

Assistant:

unsigned long PaUtil_EndBufferProcessing( PaUtilBufferProcessor* bp, int *streamCallbackResult )
{
    unsigned long framesToProcess, framesToGo;
    unsigned long framesProcessed = 0;
    
    if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0
            && bp->hostInputChannels[0][0].data /* input was supplied (see PaUtil_SetNoInput) */
            && bp->hostOutputChannels[0][0].data /* output was supplied (see PaUtil_SetNoOutput) */ )
    {
        assert( (bp->hostInputFrameCount[0] + bp->hostInputFrameCount[1]) ==
                (bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]) );
    }

    assert( *streamCallbackResult == paContinue
            || *streamCallbackResult == paComplete
            || *streamCallbackResult == paAbort ); /* don't forget to pass in a valid callback result value */

    if( bp->useNonAdaptingProcess )
    {
        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex non-adapting process, splice buffers if they are
                different lengths */

            framesToGo = bp->hostOutputFrameCount[0] + bp->hostOutputFrameCount[1]; /* relies on assert above for input/output equivalence */

            do{
                unsigned long noInputInputFrameCount;
                unsigned long *hostInputFrameCount;
                PaUtilChannelDescriptor *hostInputChannels;
                unsigned long noOutputOutputFrameCount;
                unsigned long *hostOutputFrameCount;
                PaUtilChannelDescriptor *hostOutputChannels;
                unsigned long framesProcessedThisIteration;

                if( !bp->hostInputChannels[0][0].data )
                {
                    /* no input was supplied (see PaUtil_SetNoInput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noInputInputFrameCount = framesToGo;
                    hostInputFrameCount = &noInputInputFrameCount;
                    hostInputChannels = 0;
                }
                else if( bp->hostInputFrameCount[0] != 0 )
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[0];
                    hostInputChannels = bp->hostInputChannels[0];
                }
                else
                {
                    hostInputFrameCount = &bp->hostInputFrameCount[1];
                    hostInputChannels = bp->hostInputChannels[1];
                }

                if( !bp->hostOutputChannels[0][0].data )
                {
                    /* no output was supplied (see PaUtil_SetNoOutput)
                        NonAdaptingProcess knows how to deal with this
                    */
                    noOutputOutputFrameCount = framesToGo;
                    hostOutputFrameCount = &noOutputOutputFrameCount;
                    hostOutputChannels = 0;
                }
                if( bp->hostOutputFrameCount[0] != 0 )
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[0];
                    hostOutputChannels = bp->hostOutputChannels[0];
                }
                else
                {
                    hostOutputFrameCount = &bp->hostOutputFrameCount[1];
                    hostOutputChannels = bp->hostOutputChannels[1];
                }

                framesToProcess = PA_MIN_( *hostInputFrameCount,
                                       *hostOutputFrameCount );

                assert( framesToProcess != 0 );
                
                framesProcessedThisIteration = NonAdaptingProcess( bp, streamCallbackResult,
                        hostInputChannels, hostOutputChannels,
                        framesToProcess );                                       

                *hostInputFrameCount -= framesProcessedThisIteration;
                *hostOutputFrameCount -= framesProcessedThisIteration;

                framesProcessed += framesProcessedThisIteration;
                framesToGo -= framesProcessedThisIteration;
                
            }while( framesToGo > 0 );
        }
        else
        {
            /* half duplex non-adapting process, just process 1st and 2nd buffer */
            /* process first buffer */

            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[0]
                            : bp->hostOutputFrameCount[0];

            framesProcessed = NonAdaptingProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], bp->hostOutputChannels[0],
                        framesToProcess );

            /* process second buffer if provided */
    
            framesToProcess = (bp->inputChannelCount != 0)
                            ? bp->hostInputFrameCount[1]
                            : bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += NonAdaptingProcess( bp, streamCallbackResult,
                    bp->hostInputChannels[1], bp->hostOutputChannels[1],
                    framesToProcess );
            }
        }
    }
    else /* block adaption necessary*/
    {

        if( bp->inputChannelCount != 0 && bp->outputChannelCount != 0 )
        {
            /* full duplex */
            
            if( bp->hostBufferSizeMode == paUtilVariableHostBufferSizePartialUsageAllowed  )
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        0 /* dont process partial user buffers */ );
            }
            else
            {
                framesProcessed = AdaptingProcess( bp, streamCallbackResult,
                        1 /* process partial user buffers */ );
            }
        }
        else if( bp->inputChannelCount != 0 )
        {
            /* input only */
            framesToProcess = bp->hostInputFrameCount[0];

            framesProcessed = AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[0], framesToProcess );

            framesToProcess = bp->hostInputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingInputOnlyProcess( bp, streamCallbackResult,
                        bp->hostInputChannels[1], framesToProcess );
            }
        }
        else
        {
            /* output only */
            framesToProcess = bp->hostOutputFrameCount[0];

            framesProcessed = AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[0], framesToProcess );

            framesToProcess = bp->hostOutputFrameCount[1];
            if( framesToProcess > 0 )
            {
                framesProcessed += AdaptingOutputOnlyProcess( bp, streamCallbackResult,
                        bp->hostOutputChannels[1], framesToProcess );
            }
        }
    }

    return framesProcessed;
}